

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O2

void __thiscall HashMap<int>::~HashMap(HashMap<int> *this)

{
  if (this->entries != (Node **)0x0) {
    if (this->allocator == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(this->entries);
    }
    else {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->entries = (Node **)0x0;
  SmallArray<HashMap<int>::Node_*,_32U>::~SmallArray(&this->freeList);
  ChunkedStackPool<4092>::~ChunkedStackPool(&this->nodePool);
  return;
}

Assistant:

~HashMap()
	{
		if(entries)
		{
			if(allocator)
				allocator->destruct(entries, bucketCount);
			else
				NULLC::destruct(entries, bucketCount);
		}

		entries = NULL;
	}